

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall sznet::net::EventLoop::abortNotInLoopThread(EventLoop *this)

{
  sz_pid_t v;
  self *psVar1;
  LogStream *pLVar2;
  SourceFile file;
  Logger local_ff8;
  undefined1 local_28 [12];
  
  Logger::SourceFile::SourceFile<100>
            ((SourceFile *)local_28,
             (char (*) [100])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
            );
  file._12_4_ = 0;
  file.m_data = (char *)local_28._0_8_;
  file.m_size = local_28._8_4_;
  Logger::Logger(&local_ff8,file,0xe7,FATAL);
  psVar1 = LogStream::operator<<
                     (&local_ff8.m_impl.m_stream,"EventLoop::abortNotInLoopThread - EventLoop ");
  pLVar2 = LogStream::operator<<(psVar1,this);
  psVar1 = LogStream::operator<<(pLVar2," was created in m_threadId = ");
  pLVar2 = LogStream::operator<<(psVar1,this->m_threadId);
  psVar1 = LogStream::operator<<(pLVar2,", current thread id = ");
  v = CurrentThread::tid();
  LogStream::operator<<(psVar1,v);
  Logger::~Logger(&local_ff8);
  return;
}

Assistant:

void EventLoop::abortNotInLoopThread()
{
	LOG_FATAL << "EventLoop::abortNotInLoopThread - EventLoop " << this
		<< " was created in m_threadId = " << m_threadId
		<< ", current thread id = " << CurrentThread::tid();
}